

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_mthd.c
# Opt level: O0

void decode_nvrm_mthd_device_unk1102(nvrm_mthd_device_unk1102 *m,mmt_memory_dump *args,int argc)

{
  int iVar1;
  mmt_buf *local_30;
  mmt_buf *__ret;
  mmt_buf *data;
  int argc_local;
  mmt_memory_dump *args_local;
  nvrm_mthd_device_unk1102 *m_local;
  
  if ((m->cnt != 0) || (iVar1 = _nvrm_field_enabled("cnt"), iVar1 != 0)) {
    fprintf(_stdout,"%scnt: 0x%08x",nvrm_pfx,(ulong)m->cnt);
  }
  nvrm_pfx = nvrm_sep;
  if ((m->unk04 != 0) || (iVar1 = _nvrm_field_enabled("unk04"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk04: 0x%08x",nvrm_pfx,(ulong)m->unk04);
  }
  nvrm_pfx = nvrm_sep;
  local_30 = (mmt_buf *)0x0;
  if ((m->ptr != 0) || (iVar1 = _nvrm_field_enabled("ptr"), iVar1 != 0)) {
    if (m->ptr == 0) {
      fprintf(_stdout,"%sptr: %s",nvrm_pfx,"NULL");
    }
    else {
      fprintf(_stdout,"%sptr: 0x%016lx",nvrm_pfx,m->ptr);
      if (0 < argc) {
        local_30 = find_ptr(m->ptr,args,argc);
      }
      if (local_30 == (mmt_buf *)0x0) {
        fprintf(_stdout,"%s"," [no data]");
      }
    }
  }
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"\n");
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  if (local_30 != (mmt_buf *)0x0) {
    dump_mmt_buf_as_words(local_30);
  }
  return;
}

Assistant:

static void decode_nvrm_mthd_device_unk1102(struct nvrm_mthd_device_unk1102 *m,
		struct mmt_memory_dump *args, int argc)
{
	nvrm_print_x32(m, cnt);
	nvrm_print_x32(m, unk04);
	struct mmt_buf *data = nvrm_print_ptr(m, ptr, args, argc);
	nvrm_print_ln();

	if (data)
		dump_mmt_buf_as_words(data);
}